

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value.c
# Opt level: O3

void value_destroy(value v)

{
  if (((void *)((long)v + -0x28) != (void *)0x0 && v != (value)0x0) &&
     (*(ulong *)((long)v + -0x18) < 2)) {
    if (*(code **)((long)v + -0x10) != (code *)0x0) {
      (**(code **)((long)v + -0x10))(v,*(undefined8 *)((long)v + -8));
    }
    free((void *)((long)v + -0x28));
    return;
  }
  return;
}

Assistant:

void value_destroy(value v)
{
	value_impl impl = value_descriptor(v);

	if (impl != NULL && impl->ref_count <= 1)
	{
		if (impl->finalizer != NULL)
		{
			impl->finalizer(v, impl->finalizer_data);
		}

		impl->magic = (uintptr_t)value_impl_magic_free;

		free(impl);
	}
}